

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::parse::
IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
::~IteratorInput(IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                 *this)

{
  uint uVar1;
  uint uVar2;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *pIVar3;
  bool bVar4;
  uint uVar5;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  *pIVar6;
  
  pIVar3 = this->parent;
  if (pIVar3 != (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                 *)0x0) {
    bVar4 = (this->pos).index <= (this->best).index;
    uVar1 = (&this->pos)[(ulong)bVar4 * 2].index;
    uVar2 = (pIVar3->best).index;
    uVar5 = uVar2;
    if (uVar2 < uVar1) {
      uVar5 = uVar1;
    }
    pIVar6 = &pIVar3->best;
    if (uVar2 < uVar1) {
      pIVar6 = &this->pos + (ulong)bVar4 * 2;
    }
    (pIVar3->best).container = pIVar6->container;
    (pIVar3->best).index = uVar5;
  }
  return;
}

Assistant:

~IteratorInput() {
    if (parent != nullptr) {
      parent->best = kj::max(kj::max(pos, best), parent->best);
    }
  }